

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib569.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  FILE *__stream;
  FILE *idfile;
  int i;
  int request;
  char *rtsp_session_id;
  char *stream_uri;
  CURL *curl;
  char *pcStack_18;
  int res;
  char *URL_local;
  
  rtsp_session_id = (char *)0x0;
  idfile._4_4_ = 1;
  pcStack_18 = URL;
  __stream = fopen64(libtest_arg2,"wb");
  if (__stream == (FILE *)0x0) {
    curl_mfprintf(_stderr,"couldn\'t open the Session ID File\n");
    URL_local._4_4_ = 0x7e;
  }
  else {
    iVar1 = curl_global_init(3);
    if (iVar1 == 0) {
      stream_uri = (char *)curl_easy_init();
      if (stream_uri == (char *)0x0) {
        curl_mfprintf(_stderr,"curl_easy_init() failed\n");
        curl_global_cleanup();
        fclose(__stream);
        URL_local._4_4_ = 0x7e;
      }
      else {
        curl._4_4_ = curl_easy_setopt(stream_uri,0x272d,_stdout);
        if ((((curl._4_4_ == 0) &&
             (curl._4_4_ = curl_easy_setopt(stream_uri,0x2711,_stdout), curl._4_4_ == 0)) &&
            (curl._4_4_ = curl_easy_setopt(stream_uri,0x29,1), curl._4_4_ == 0)) &&
           ((curl._4_4_ = curl_easy_setopt(stream_uri,0x2712,pcStack_18), curl._4_4_ == 0 &&
            (curl._4_4_ = curl_easy_setopt(stream_uri,0xbd,4), curl._4_4_ == 0)))) {
          curl._4_4_ = curl_easy_perform(stream_uri);
          if (curl._4_4_ == 0x2b) {
            curl._4_4_ = 0x2b;
            for (idfile._0_4_ = 0; (int)idfile < 3; idfile._0_4_ = (int)idfile + 1) {
              iVar1 = idfile._4_4_ + 1;
              rtsp_session_id = suburl(pcStack_18,idfile._4_4_);
              if (rtsp_session_id == (char *)0x0) {
                curl._4_4_ = 0x7e;
                break;
              }
              curl._4_4_ = curl_easy_setopt(stream_uri,0x27cf,rtsp_session_id);
              if (curl._4_4_ != 0) break;
              free(rtsp_session_id);
              rtsp_session_id = (char *)0x0;
              curl._4_4_ = curl_easy_setopt(stream_uri,0xbd,4);
              if (((curl._4_4_ != 0) ||
                  (curl._4_4_ = curl_easy_setopt(stream_uri,0x27d0,"Fake/NotReal/JustATest;foo=baz")
                  , curl._4_4_ != 0)) ||
                 (curl._4_4_ = curl_easy_perform(stream_uri), curl._4_4_ != 0)) break;
              curl_easy_getinfo(stream_uri,0x100024,&i);
              curl_mfprintf(__stream,"Got Session ID: [%s]\n",_i);
              _i = 0;
              idfile._4_4_ = idfile._4_4_ + 2;
              rtsp_session_id = suburl(pcStack_18,iVar1);
              if (rtsp_session_id == (char *)0x0) {
                curl._4_4_ = 0x7e;
                break;
              }
              curl._4_4_ = curl_easy_setopt(stream_uri,0x27cf,rtsp_session_id);
              if (curl._4_4_ != 0) break;
              free(rtsp_session_id);
              rtsp_session_id = (char *)0x0;
              curl._4_4_ = curl_easy_setopt(stream_uri,0xbd,7);
              if (curl._4_4_ != 0) break;
              curl._4_4_ = curl_easy_perform(stream_uri);
              curl._4_4_ = curl_easy_setopt(stream_uri,0x27ce,0);
              if (curl._4_4_ != 0) break;
            }
          }
          else {
            curl_mfprintf(_stderr,
                          "This should have failed. Cannot setup without a Transport: header");
            curl._4_4_ = 0x7e;
          }
        }
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        free(rtsp_session_id);
        curl_easy_cleanup(stream_uri);
        curl_global_cleanup();
        URL_local._4_4_ = curl._4_4_;
      }
    }
    else {
      curl_mfprintf(_stderr,"curl_global_init() failed\n");
      fclose(__stream);
      URL_local._4_4_ = 0x7e;
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res;
  CURL *curl;
  char *stream_uri = NULL;
  char *rtsp_session_id;
  int request=1;
  int i;
  FILE *idfile = NULL;

  idfile = fopen(libtest_arg2, "wb");
  if(idfile == NULL) {
    fprintf(stderr, "couldn't open the Session ID File\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(idfile);
    return TEST_ERR_MAJOR_BAD;
  }

  if((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(idfile);
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_HEADERDATA, stdout);
  test_setopt(curl, CURLOPT_WRITEDATA, stdout);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  test_setopt(curl, CURLOPT_URL, URL);

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_SETUP);
  res = curl_easy_perform(curl);
  if(res != (int)CURLE_BAD_FUNCTION_ARGUMENT) {
    fprintf(stderr, "This should have failed. "
            "Cannot setup without a Transport: header");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Go through the various Session IDs */
  for(i = 0; i < 3; i++) {
    if((stream_uri = suburl(URL, request++)) == NULL) {
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }
    test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
    free(stream_uri);
    stream_uri = NULL;

    test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_SETUP);
    test_setopt(curl, CURLOPT_RTSP_TRANSPORT,
                "Fake/NotReal/JustATest;foo=baz");
    res = curl_easy_perform(curl);
    if(res)
      goto test_cleanup;

    curl_easy_getinfo(curl, CURLINFO_RTSP_SESSION_ID, &rtsp_session_id);
    fprintf(idfile, "Got Session ID: [%s]\n", rtsp_session_id);
    rtsp_session_id = NULL;

    if((stream_uri = suburl(URL, request++)) == NULL) {
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }
    test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
    free(stream_uri);
    stream_uri = NULL;

    test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_TEARDOWN);
    res = curl_easy_perform(curl);

    /* Clear for the next go-round */
    test_setopt(curl, CURLOPT_RTSP_SESSION_ID, NULL);
  }

test_cleanup:

  if(idfile)
    fclose(idfile);

  free(stream_uri);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}